

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmaster.c
# Opt level: O2

void EBML_MasterSort(ebml_master *Element,arraycmp Cmp,void *CmpParam)

{
  long lVar1;
  nodetree *pnVar2;
  code *Cmp_00;
  ebml_master *CmpParam_00;
  long *plVar3;
  nodetree *local_50;
  array local_48;
  ebml_master *local_38;
  
  local_48._Begin = (char *)0x0;
  local_48._Used = 0;
  pnVar2 = (Element->Base).Base.Children;
  local_38 = (ebml_master *)CmpParam;
  do {
    local_50 = pnVar2;
    if (pnVar2 == (nodetree *)0x0) {
      Cmp_00 = Cmp;
      CmpParam_00 = local_38;
      if (Cmp == (arraycmp)0x0) {
        Cmp_00 = EbmlCmp;
        CmpParam_00 = Element;
      }
      ArraySortEx(&local_48,local_48._Used >> 3,8,Cmp_00,CmpParam_00,0);
      EBML_MasterClear(Element);
      local_50 = (nodetree *)0x0;
      plVar3 = (long *)local_48._Begin;
      while( true ) {
        if (plVar3 == (long *)((local_48._Used & 0xfffffffffffffff8) + (long)local_48._Begin)) {
          ArrayClear(&local_48);
          return;
        }
        lVar1 = *plVar3;
        if (lVar1 == 0) break;
        (**(code **)(*(long *)(lVar1 + 8) + 0x48))(lVar1,Element,0);
        local_50 = (nodetree *)*plVar3;
        plVar3 = plVar3 + 1;
      }
      __assert_fail("(const void*)(*j)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                    ,0x84,"void EBML_MasterSort(ebml_master *, arraycmp, const void *)");
    }
    ArrayAppend(&local_48,&local_50,8,0x40);
    pnVar2 = local_50->Next;
  } while (local_50 != pnVar2);
  __assert_fail("(nodetree*)(i) != ((nodetree*)(i))->Next",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                ,0x78,"void EBML_MasterSort(ebml_master *, arraycmp, const void *)");
}

Assistant:

void EBML_MasterSort(ebml_master *Element, arraycmp Cmp, const void* CmpParam)
{
    array Elts;
    ebml_element *i,**j;
    ArrayInit(&Elts);
    for (i=EBML_MasterChildren(Element);i;i=EBML_MasterNext(i))
        ArrayAppend(&Elts,&i,sizeof(i),64);
    if (Cmp)
        ArraySort(&Elts,ebml_element*,Cmp,CmpParam,0);
    else
        ArraySort(&Elts,ebml_element*,EbmlCmp,Element,0);

    // refill the master with the new order
    EBML_MasterClear(Element);
    i = NULL;
    for (j=ARRAYBEGIN(Elts,ebml_element*);j!=ARRAYEND(Elts,ebml_element*);++j)
    {
        NodeTree_SetParent(*j,Element,NULL);
        i = *j;
    }
    ArrayClear(&Elts);
}